

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathedit.cpp
# Opt level: O3

void __thiscall QPathEdit::QPathEdit(QPathEdit *this,PathMode pathMode,QWidget *parent,Style style)

{
  undefined4 uVar1;
  QLineEdit *pQVar2;
  QCompleter *pQVar3;
  QFileSystemModel *pQVar4;
  PathValidator *this_00;
  QFileDialog *pQVar5;
  QToolButton *this_01;
  QAction *pQVar6;
  undefined4 *puVar7;
  QMargins *this_02;
  int extraout_var;
  QByteArrayView QVar8;
  QString local_b8;
  undefined1 local_98 [8];
  ImplFn p_Stack_90;
  qsizetype local_88;
  QString local_78;
  QFileSystemModel *local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00155960;
  *(undefined ***)&this->field_0x10 = &PTR__QPathEdit_00155b10;
  pQVar2 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar2,&this->super_QWidget);
  this->edit = pQVar2;
  pQVar3 = (QCompleter *)operator_new(0x10);
  QCompleter::QCompleter(pQVar3,(QObject *)this);
  this->pathCompleter = pQVar3;
  pQVar4 = (QFileSystemModel *)operator_new(0x10);
  QFileSystemModel::QFileSystemModel(pQVar4,(QObject *)this);
  this->completerModel = pQVar4;
  this_00 = (PathValidator *)operator_new(0x18);
  PathValidator::PathValidator(this_00,(QObject *)this);
  this->pathValidator = this_00;
  pQVar5 = (QFileDialog *)operator_new(0x28);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  local_88 = 0;
  local_98 = (undefined1  [8])0x0;
  p_Stack_90 = (ImplFn)0x0;
  local_78.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  QFileDialog::QFileDialog(pQVar5,&this->super_QWidget,&local_b8,(QString *)local_98,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,8);
    }
  }
  if (local_98 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)local_98 = *(int *)local_98 + -1;
    UNLOCK();
    if (*(int *)local_98 == 0) {
      QArrayData::deallocate((QArrayData *)local_98,2,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  this->dialog = pQVar5;
  (this->currentValidPath).d.d = (Data *)0x0;
  (this->currentValidPath).d.ptr = (char16_t *)0x0;
  (this->currentValidPath).d.size = 0;
  this->wasPathValid = true;
  this->uiStyle = style;
  this->mode = ExistingFile;
  QStandardPaths::writableLocation((StandardLocation)&this->defaultDir);
  this->allowEmpty = true;
  local_60 = (QFileSystemModel *)&this->defaultDir;
  this_01 = (QToolButton *)operator_new(0x28);
  QToolButton::QToolButton(this_01,&this->super_QWidget);
  this->toolButton = this_01;
  pQVar6 = (QAction *)operator_new(0x10);
  getDefaultIcon((QPathEdit *)local_98);
  QMetaObject::tr((char *)&local_b8,(char *)&staticMetaObject,0x1417f0);
  QAction::QAction(pQVar6,(QIcon *)local_98,&local_b8,(QObject *)this);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,8);
    }
  }
  QIcon::~QIcon((QIcon *)local_98);
  this->dialogAction = pQVar6;
  this->hasCustomIcon = false;
  masterDialog((QDialog *)this->dialog);
  setPathMode(this,pathMode);
  pQVar5 = this->dialog;
  local_b8.d.d = (Data *)QFileDialog::fileSelected;
  local_b8.d.ptr = (char16_t *)0x0;
  local_98 = (undefined1  [8])dialogFileSelected;
  p_Stack_90 = (ImplFn)0x0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QSlotObject<void_(QPathEdit::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>::
       impl;
  *(code **)(puVar7 + 4) = dialogFileSelected;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_38,(void **)pQVar5,(QObject *)&local_b8,(void **)this,(QSlotObjectBase *)local_98
             ,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QVar8.m_data = (storage_type *)0x0;
  QVar8.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar8);
  local_98 = (undefined1  [8])local_b8.d.d;
  p_Stack_90 = (ImplFn)local_b8.d.ptr;
  local_88 = local_b8.d.size;
  QFileSystemModel::setRootPath(&local_b8);
  if (local_98 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)local_98 = *(int *)local_98 + -1;
    UNLOCK();
    if (*(int *)local_98 == 0) {
      QArrayData::deallocate((QArrayData *)local_98,2,8);
    }
  }
  QFileSystemModel::setNameFilterDisables(SUB81(this->completerModel,0));
  pQVar3 = this->pathCompleter;
  pQVar4 = this->completerModel;
  local_b8.d.d = (Data *)QFileSystemModel::directoryLoaded;
  local_b8.d.ptr = (char16_t *)0x0;
  puVar7 = (undefined4 *)operator_new(0x18);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/freeserf[P]fsstudio/src/qpathedit.cpp:66:11),_1,_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(QPathEdit **)(puVar7 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)pQVar4,(QObject *)&local_b8,(void **)pQVar3,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QCompleter::setModel((QAbstractItemModel *)this->pathCompleter);
  this_02 = (QMargins *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout((QHBoxLayout *)this_02,&this->super_QWidget);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  QLayout::setContentsMargins(this_02);
  (**(code **)(*(long *)this_02 + 0x68))(this_02,0);
  QBoxLayout::addWidget(this_02,this->edit,0,0);
  QBoxLayout::addWidget(this_02,this->toolButton,0,0);
  QWidget::setLayout((QLayout *)this);
  QObject::installEventFilter((QObject *)this->edit);
  QLineEdit::setCompleter((QCompleter *)this->edit);
  QLineEdit::setValidator((QValidator *)this->edit);
  QLineEdit::setDragEnabled(SUB81(this->edit,0));
  QLineEdit::setReadOnly(SUB81(this->edit,0));
  pQVar2 = this->edit;
  local_b8.d.d = (Data *)QLineEdit::editingFinished;
  local_b8.d.ptr = (char16_t *)0x0;
  local_98 = (undefined1  [8])editTextUpdate;
  p_Stack_90 = (ImplFn)0x0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QSlotObject<void_(QPathEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar7 + 4) = editTextUpdate;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar2,(QObject *)&local_b8,(void **)this,(QSlotObjectBase *)local_98
             ,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar2 = this->edit;
  local_b8.d.d = (Data *)QLineEdit::textChanged;
  local_b8.d.ptr = (char16_t *)0x0;
  local_98 = (undefined1  [8])updateValidInfo;
  p_Stack_90 = (ImplFn)0x0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::
       QSlotObject<void_(QPathEdit::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>::
       impl;
  *(code **)(puVar7 + 4) = updateValidInfo;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar2,(QObject *)&local_b8,(void **)this,(QSlotObjectBase *)local_98
             ,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar6 = this->dialogAction;
  local_b8.d.d = (Data *)QAction::triggered;
  local_b8.d.ptr = (char16_t *)0x0;
  local_98 = (undefined1  [8])showDialog;
  p_Stack_90 = (ImplFn)0x0;
  puVar7 = (undefined4 *)operator_new(0x20);
  *puVar7 = 1;
  *(code **)(puVar7 + 2) =
       QtPrivate::QSlotObject<void_(QPathEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar7 + 4) = showDialog;
  *(undefined8 *)(puVar7 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar6,(QObject *)&local_b8,(void **)this,(QSlotObjectBase *)local_98
             ,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QToolButton::setDefaultAction((QAction *)this->toolButton);
  (**(code **)(*(long *)this->edit + 0x70))();
  QWidget::setFixedSize((int)this->toolButton,extraout_var);
  if (style == JoinedButton) {
    QLineEdit::addAction((QAction *)this->edit,(ActionPosition)this->dialogAction);
  }
  else if (style != NoButton) goto LAB_00125782;
  (**(code **)(*(long *)this->toolButton + 0x68))(this->toolButton,0);
LAB_00125782:
  QWidget::setTabOrder((QWidget *)this->edit,(QWidget *)this->toolButton);
  uVar1 = QWidget::focusPolicy();
  QWidget::setFocusPolicy(this,uVar1);
  QWidget::setFocusProxy(&this->super_QWidget);
  return;
}

Assistant:

QPathEdit::QPathEdit(QPathEdit::PathMode pathMode, QWidget *parent,
                     QPathEdit::Style style)
  : QWidget(parent)
  , edit(new QLineEdit(this))
  , pathCompleter(new QCompleter(this)),
	completerModel(new QFileSystemModel(this)),
	pathValidator(new PathValidator(this)),
	dialog(new QFileDialog(this)),
	currentValidPath(),
	wasPathValid(true),
	uiStyle(style),
	mode(ExistingFile),
	defaultDir(QStandardPaths::writableLocation(QStandardPaths::HomeLocation)),
	allowEmpty(true),
	toolButton(new QToolButton(this)),
	dialogAction(new QAction(getDefaultIcon(), tr("Open File-Dialog"), this)),
	hasCustomIcon(false)
{
	//setup dialog
	masterDialog(dialog);
	setPathMode(pathMode);
	connect(dialog, &QFileDialog::fileSelected, this, &QPathEdit::dialogFileSelected);

	//setup completer
	completerModel->setRootPath("");
	completerModel->setNameFilterDisables(false);
	connect(completerModel, &QFileSystemModel::directoryLoaded, pathCompleter,
          [this](QString){ pathCompleter->complete(); });
	pathCompleter->setModel(completerModel);

	//setup this
	QHBoxLayout *layout = new QHBoxLayout(this);
	layout->setContentsMargins(QMargins());
	layout->setSpacing(0);
	layout->addWidget(edit);
	layout->addWidget(toolButton);
	setLayout(layout);
	//setup lineedit
	edit->installEventFilter(this);
	edit->setCompleter(pathCompleter);
	edit->setValidator(pathValidator);
	edit->setDragEnabled(true);
	edit->setReadOnly(true);
	connect(edit, &QLineEdit::editingFinished, this, &QPathEdit::editTextUpdate);
	connect(edit, &QLineEdit::textChanged, this, &QPathEdit::updateValidInfo);
	//setup "button"
	connect(dialogAction, &QAction::triggered, this, &QPathEdit::showDialog);
	toolButton->setDefaultAction(dialogAction);
	int height = edit->sizeHint().height();
#ifdef Q_OS_WIN
	height += 2;
#endif
	toolButton->setFixedSize(height, height);
	switch(style) {
	  case JoinedButton:
		  edit->addAction(dialogAction, QLineEdit::TrailingPosition);
	  case NoButton:
		  toolButton->setVisible(false);
		  break;
	  default:
		  break;
	}

	QWidget::setTabOrder(edit, toolButton);
	setFocusPolicy(edit->focusPolicy());
	setFocusProxy(edit);
}